

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RegexRuntime.cpp
# Opt level: O0

int __thiscall
UnifiedRegex::SyncToSetAndConsumeInst<true>::Print
          (SyncToSetAndConsumeInst<true> *this,DebugWriter *w,Label label,Char *litbuf)

{
  Char *litbuf_local;
  Label label_local;
  DebugWriter *w_local;
  SyncToSetAndConsumeInst<true> *this_local;
  
  DebugWriter::Print(w,L"L%04x: ",(ulong)label);
  if ((DAT_01ec73dd & 1) != 0) {
    DebugWriter::Print(w,L"(0x%03x bytes) ",0x29);
  }
  DebugWriter::Print(w,L"SyncToNegatedSetAndConsume");
  DebugWriter::Print(w,L"(");
  SetMixin<true>::Print(&this->super_SetMixin<true>,w,litbuf);
  DebugWriter::PrintEOL(w,L")");
  if ((DAT_01ec73dd & 1) != 0) {
    DebugWriter::Indent(w);
    Inst::PrintBytes<UnifiedRegex::Inst>
              (&this->super_Inst,w,&this->super_Inst,&this->super_Inst,L"Inst");
    Inst::PrintBytes<UnifiedRegex::SetMixin<true>>
              (&this->super_Inst,w,&this->super_Inst,&this->super_SetMixin<true>,L"SetMixin<true>");
    DebugWriter::Unindent(w);
  }
  return 0x29;
}

Assistant:

int SyncToSetAndConsumeInst<IsNegation>::Print(DebugWriter* w, Label label, const Char* litbuf) const
    {
        if (IsNegation)
        {
            PRINT_RE_BYTECODE_BEGIN("SyncToNegatedSetAndConsume");
            PRINT_MIXIN(SetMixin<true>);
        }
        else
        {
            PRINT_RE_BYTECODE_BEGIN("SyncToSetAndConsume");
            PRINT_MIXIN(SetMixin<false>);
        }

        PRINT_RE_BYTECODE_MID();
        IsNegation ? PRINT_BYTES(SetMixin<true>) : PRINT_BYTES(SetMixin<false>);
        PRINT_RE_BYTECODE_END();
    }